

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert_to_half_pass.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::ConvertToHalfPass::ProcessDefault(ConvertToHalfPass *this,Instruction *inst)

{
  bool bVar1;
  DefUseManager *this_00;
  bool modified;
  Instruction *inst_local;
  _Any_data local_40;
  code *local_30;
  code *local_28;
  
  inst_local = inst;
  if (inst->opcode_ == OpPhi) {
    bVar1 = ProcessPhi(this,inst,0x10,0x20);
    return bVar1;
  }
  modified = false;
  local_40._8_8_ = 0;
  local_40._M_unused._M_object = ::operator_new(0x18);
  *(Instruction ***)local_40._M_unused._0_8_ = &inst_local;
  *(bool **)((long)local_40._M_unused._0_8_ + 8) = &modified;
  *(ConvertToHalfPass **)((long)local_40._M_unused._0_8_ + 0x10) = this;
  local_28 = std::
             _Function_handler<void_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/convert_to_half_pass.cpp:281:21)>
             ::_M_invoke;
  local_30 = std::
             _Function_handler<void_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/convert_to_half_pass.cpp:281:21)>
             ::_M_manager;
  Instruction::ForEachInId(inst,(function<void_(unsigned_int_*)> *)&local_40);
  if (local_30 != (code *)0x0) {
    (*local_30)(&local_40,&local_40,__destroy_functor);
  }
  if (modified == true) {
    this_00 = Pass::get_def_use_mgr(&this->super_Pass);
    analysis::DefUseManager::AnalyzeInstUse(this_00,inst_local);
  }
  else {
    modified = false;
  }
  return (bool)(modified & 1);
}

Assistant:

bool ConvertToHalfPass::ProcessDefault(Instruction* inst) {
  // If non-relaxed instruction has changed operands, need to convert
  // them back to float32
  if (inst->opcode() == spv::Op::OpPhi) return ProcessPhi(inst, 16u, 32u);
  bool modified = false;
  inst->ForEachInId([&inst, &modified, this](uint32_t* idp) {
    if (converted_ids_.count(*idp) == 0) return;
    uint32_t old_id = *idp;
    GenConvert(idp, 32, inst);
    if (*idp != old_id) modified = true;
  });
  if (modified) get_def_use_mgr()->AnalyzeInstUse(inst);
  return modified;
}